

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenInitializer::AddCMakeProcessToCommandLines
          (cmQtAutoGenInitializer *this,string *infoFile,string *processName,
          cmCustomCommandLines *commandLines)

{
  pointer pbVar1;
  int iVar2;
  string *psVar3;
  string *config;
  pointer pbVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist_01;
  string autoInfoFileConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  undefined1 local_c8 [17];
  undefined7 uStack_b7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  undefined8 local_98;
  char *local_90;
  size_type local_88;
  pointer local_80;
  size_type local_78;
  pointer local_70;
  pointer local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((this->CrossConfig == true) && (this->UseBetterGraph == true)) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_a8._8_8_ = (psVar3->_M_dataplus)._M_p;
    local_a8._M_allocated_capacity = psVar3->_M_string_length;
    local_98 = 2;
    local_90 = "-E";
    local_80 = (processName->_M_dataplus)._M_p;
    local_88 = processName->_M_string_length;
    local_70 = (infoFile->_M_dataplus)._M_p;
    local_78 = infoFile->_M_string_length;
    local_68 = (pointer)0x9;
    local_60 = (pointer)0x83c20c;
    local_58 = 0x1b;
    local_50 = "$<COMMAND_CONFIG:$<CONFIG>>";
    ilist._M_len = 6;
    ilist._M_array = (iterator)&local_a8;
    cmMakeCommandLine((cmCustomCommandLine *)local_c8,ilist);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
  }
  else if (((this->MultiConfig == true) &&
           (iVar2 = (*this->GlobalGen->_vptr_cmGlobalGenerator[0x29])(), (char)iVar2 != '\0')) ||
          (this->CrossConfig == true)) {
    pbVar4 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      do {
        psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_a8._8_8_ = (psVar3->_M_dataplus)._M_p;
        local_a8._M_allocated_capacity = psVar3->_M_string_length;
        local_98 = 2;
        local_90 = "-E";
        local_80 = (processName->_M_dataplus)._M_p;
        local_88 = processName->_M_string_length;
        local_70 = (infoFile->_M_dataplus)._M_p;
        local_78 = infoFile->_M_string_length;
        local_60 = (pointer)(pbVar4->_M_dataplus)._M_p;
        local_68 = (pointer)pbVar4->_M_string_length;
        ilist_00._M_len = 5;
        ilist_00._M_array = (iterator)&local_a8;
        cmMakeCommandLine((cmCustomCommandLine *)local_c8,ilist_00);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&commandLines->
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (cmCustomCommandLine *)local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c8);
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
  }
  else {
    pbVar4 = (pointer)(local_c8 + 0x10);
    local_c8._8_8_ = (pointer)0x0;
    local_c8[0x10] = 0;
    local_c8._0_8_ = pbVar4;
    if (this->MultiConfig == true) {
      std::__cxx11::string::_M_replace((ulong)local_c8,0,(char *)0x0,0x83c20c);
    }
    else {
      local_a8._M_allocated_capacity = 0;
      local_a8._8_8_ = (pointer)0x0;
      local_98 = 0;
      (*this->GlobalGen->_vptr_cmGlobalGenerator[0x3b])();
      std::__cxx11::string::_M_assign((string *)local_c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
    }
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_a8._8_8_ = (psVar3->_M_dataplus)._M_p;
    local_a8._M_allocated_capacity = psVar3->_M_string_length;
    local_98 = 2;
    local_90 = "-E";
    local_80 = (processName->_M_dataplus)._M_p;
    local_88 = processName->_M_string_length;
    local_70 = (infoFile->_M_dataplus)._M_p;
    local_78 = infoFile->_M_string_length;
    local_68 = (pointer)local_c8._8_8_;
    local_60 = (pointer)local_c8._0_8_;
    ilist_01._M_len = 5;
    ilist_01._M_array = (iterator)&local_a8;
    cmMakeCommandLine((cmCustomCommandLine *)&local_48,ilist_01);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
    emplace_back<cmCustomCommandLine>
              (&commandLines->
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (cmCustomCommandLine *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    if ((pointer)local_c8._0_8_ != pbVar4) {
      operator_delete((void *)local_c8._0_8_,CONCAT71(uStack_b7,local_c8[0x10]) + 1);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddCMakeProcessToCommandLines(
  std::string const& infoFile, std::string const& processName,
  cmCustomCommandLines& commandLines)
{
  if (this->CrossConfig && this->UseBetterGraph) {
    commandLines.push_back(cmMakeCommandLine(
      { cmSystemTools::GetCMakeCommand(), "-E", processName, infoFile,
        "$<CONFIG>", "$<COMMAND_CONFIG:$<CONFIG>>" }));
  } else if ((this->MultiConfig && this->GlobalGen->IsXcode()) ||
             this->CrossConfig) {
    for (std::string const& config : this->ConfigsList) {
      commandLines.push_back(
        cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E",
                            processName, infoFile, config }));
    }
  } else {
    std::string autoInfoFileConfig;
    if (this->MultiConfig) {
      autoInfoFileConfig = "$<CONFIG>";
    } else {
      std::vector<std::string> configs;
      this->GlobalGen->GetQtAutoGenConfigs(configs);
      autoInfoFileConfig = configs[0];
    }
    commandLines.push_back(
      cmMakeCommandLine({ cmSystemTools::GetCMakeCommand(), "-E", processName,
                          infoFile, autoInfoFileConfig }));
  }
}